

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::base::LogDispatcher::dispatch(LogDispatcher *this)

{
  long *plVar1;
  LogDispatchData data;
  LogMessage *local_60;
  DispatchAction local_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
  local_50;
  
  if ((this->m_proceed == true) && (this->m_dispatchAction == None)) {
    this->m_proceed = false;
  }
  else if (this->m_proceed != false) {
    if ((*(byte *)(elStorage + 0x18) & 0x20) != 0) {
      TypedConfigurations::validateFileRolling
                (this->m_logMessage->m_logger->m_typedConfigurations,this->m_logMessage->m_level,
                 (PreRollOutCallback *)(elStorage + 0x90));
    }
    local_60 = (LogMessage *)0x0;
    local_58 = None;
    plVar1 = (long *)(elStorage + 0xc0);
    while (plVar1 = (long *)*plVar1, plVar1 != (long *)0x0) {
      utils::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_true>
                (&local_50,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
                  *)(plVar1 + 1));
      if ((local_50.second.super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0) &&
         (((local_50.second.super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_Callback<el::LogDispatchData>).super_ThreadSafe.field_0x9 == '\x01')) {
        local_60 = this->m_logMessage;
        local_58 = this->m_dispatchAction;
        (*((local_50.second.super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_Callback<el::LogDispatchData>).super_ThreadSafe._vptr_ThreadSafe[5])
                  (local_50.second.
                   super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   &local_60);
      }
      utils::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
      ::~pair(&local_50);
    }
  }
  return;
}

Assistant:

void LogDispatcher::dispatch(void) {
  if (m_proceed && m_dispatchAction == base::DispatchAction::None) {
    m_proceed = false;
  }
  if (!m_proceed) {
    return;
  }
  base::TypedConfigurations* tc = m_logMessage->logger()->m_typedConfigurations;
  if (ELPP->hasFlag(LoggingFlag::StrictLogFileSizeCheck)) {
    tc->validateFileRolling(m_logMessage->level(), ELPP->preRollOutCallback());
  }
  LogDispatchCallback* callback = nullptr;
  LogDispatchData data;
  for (const std::pair<std::string, base::type::LogDispatchCallbackPtr>& h
       : ELPP->m_logDispatchCallbacks) {
    callback = h.second.get();
    if (callback != nullptr && callback->enabled()) {
      data.setLogMessage(m_logMessage);
      data.setDispatchAction(m_dispatchAction);
      callback->handle(&data);
    }
  }
}